

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * fts5ExprPrintTcl(Fts5Config *pConfig,char *zNearsetCmd,Fts5ExprNode *pExpr)

{
  uint *puVar1;
  int *piVar2;
  long lVar3;
  char *pcVar4;
  Fts5ExprNode *extraout_RDX;
  Fts5ExprNode *extraout_RDX_00;
  Fts5ExprNode *extraout_RDX_01;
  Fts5ExprNode *pExpr_00;
  char *pcVar5;
  long lVar6;
  undefined8 *puVar7;
  long lVar8;
  
  switch(*(undefined4 *)zNearsetCmd) {
  case 2:
    pcVar5 = "AND";
    break;
  case 3:
    pcVar5 = "NOT";
    break;
  case 4:
  case 9:
    puVar1 = *(uint **)(zNearsetCmd + 0x20);
    pcVar5 = fts5PrintfAppend((char *)0x0,"%s ",pConfig);
    if (pcVar5 == (char *)0x0) {
      return (char *)0x0;
    }
    piVar2 = *(int **)(puVar1 + 2);
    if (piVar2 != (int *)0x0) {
      if (*piVar2 == 1) {
        pcVar5 = fts5PrintfAppend(pcVar5,"-col %d ",(ulong)(uint)piVar2[1]);
      }
      else {
        pcVar5 = fts5PrintfAppend(pcVar5,"-col {%d",(ulong)(uint)piVar2[1]);
        for (lVar6 = 1; lVar6 < **(int **)(puVar1 + 2); lVar6 = lVar6 + 1) {
          pcVar5 = fts5PrintfAppend(pcVar5," %d",(ulong)(uint)piVar2[lVar6 + 1]);
        }
        pcVar5 = fts5PrintfAppend(pcVar5,"} ");
      }
      if (pcVar5 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if ((1 < (int)puVar1[4]) &&
       (pcVar5 = fts5PrintfAppend(pcVar5,"-near %d ",(ulong)*puVar1), pcVar5 == (char *)0x0)) {
      return (char *)0x0;
    }
    pcVar5 = fts5PrintfAppend(pcVar5,"--");
    if (pcVar5 == (char *)0x0) {
      return (char *)0x0;
    }
    lVar6 = 0;
    do {
      if ((int)puVar1[4] <= lVar6) {
        return pcVar5;
      }
      lVar3 = *(long *)(puVar1 + lVar6 * 2 + 6);
      pcVar5 = fts5PrintfAppend(pcVar5," {");
      puVar7 = (undefined8 *)(lVar3 + 0x28);
      lVar8 = 0;
      while( true ) {
        if (pcVar5 == (char *)0x0) {
          return (char *)0x0;
        }
        if (*(int *)(lVar3 + 0x18) <= lVar8) break;
        pcVar4 = " ";
        if (lVar8 == 0) {
          pcVar4 = "";
        }
        pcVar5 = fts5PrintfAppend(pcVar5,"%s%s",pcVar4,*puVar7);
        if (*(char *)(puVar7 + -1) != '\0') {
          pcVar5 = fts5PrintfAppend(pcVar5,"*");
        }
        lVar8 = lVar8 + 1;
        puVar7 = puVar7 + 4;
      }
      pcVar5 = fts5PrintfAppend(pcVar5,"}");
      lVar6 = lVar6 + 1;
    } while (pcVar5 != (char *)0x0);
    return (char *)0x0;
  default:
    pcVar5 = "OR";
  }
  pcVar5 = sqlite3_mprintf("%s",pcVar5);
  lVar6 = 0;
  pExpr_00 = extraout_RDX;
  while( true ) {
    if (pcVar5 == (char *)0x0) {
      return (char *)0x0;
    }
    if (*(int *)(zNearsetCmd + 0x28) <= lVar6) break;
    pcVar4 = fts5ExprPrintTcl(pConfig,*(char **)(zNearsetCmd + lVar6 * 8 + 0x30),pExpr_00);
    if (pcVar4 == (char *)0x0) {
      sqlite3_free(pcVar5);
      pcVar5 = (char *)0x0;
      pExpr_00 = extraout_RDX_01;
    }
    else {
      pcVar5 = fts5PrintfAppend(pcVar5," [%z]",pcVar4);
      pExpr_00 = extraout_RDX_00;
    }
    lVar6 = lVar6 + 1;
  }
  return pcVar5;
}

Assistant:

static char *fts5ExprPrintTcl(
  Fts5Config *pConfig, 
  const char *zNearsetCmd,
  Fts5ExprNode *pExpr
){
  char *zRet = 0;
  if( pExpr->eType==FTS5_STRING || pExpr->eType==FTS5_TERM ){
    Fts5ExprNearset *pNear = pExpr->pNear;
    int i; 
    int iTerm;

    zRet = fts5PrintfAppend(zRet, "%s ", zNearsetCmd);
    if( zRet==0 ) return 0;
    if( pNear->pColset ){
      int *aiCol = pNear->pColset->aiCol;
      int nCol = pNear->pColset->nCol;
      if( nCol==1 ){
        zRet = fts5PrintfAppend(zRet, "-col %d ", aiCol[0]);
      }else{
        zRet = fts5PrintfAppend(zRet, "-col {%d", aiCol[0]);
        for(i=1; i<pNear->pColset->nCol; i++){
          zRet = fts5PrintfAppend(zRet, " %d", aiCol[i]);
        }
        zRet = fts5PrintfAppend(zRet, "} ");
      }
      if( zRet==0 ) return 0;
    }

    if( pNear->nPhrase>1 ){
      zRet = fts5PrintfAppend(zRet, "-near %d ", pNear->nNear);
      if( zRet==0 ) return 0;
    }

    zRet = fts5PrintfAppend(zRet, "--");
    if( zRet==0 ) return 0;

    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];

      zRet = fts5PrintfAppend(zRet, " {");
      for(iTerm=0; zRet && iTerm<pPhrase->nTerm; iTerm++){
        char *zTerm = pPhrase->aTerm[iTerm].zTerm;
        zRet = fts5PrintfAppend(zRet, "%s%s", iTerm==0?"":" ", zTerm);
        if( pPhrase->aTerm[iTerm].bPrefix ){
          zRet = fts5PrintfAppend(zRet, "*");
        }
      }

      if( zRet ) zRet = fts5PrintfAppend(zRet, "}");
      if( zRet==0 ) return 0;
    }

  }else{
    char const *zOp = 0;
    int i;
    switch( pExpr->eType ){
      case FTS5_AND: zOp = "AND"; break;
      case FTS5_NOT: zOp = "NOT"; break;
      default: 
        assert( pExpr->eType==FTS5_OR );
        zOp = "OR"; 
        break;
    }

    zRet = sqlite3_mprintf("%s", zOp);
    for(i=0; zRet && i<pExpr->nChild; i++){
      char *z = fts5ExprPrintTcl(pConfig, zNearsetCmd, pExpr->apChild[i]);
      if( !z ){
        sqlite3_free(zRet);
        zRet = 0;
      }else{
        zRet = fts5PrintfAppend(zRet, " [%z]", z);
      }
    }
  }

  return zRet;
}